

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

ParseNodeBlock * __thiscall Parser::ParseBlock<true>(Parser *this,LabelId *pLabelId)

{
  ParseNodeBlock *pPVar1;
  ParseNodeBlock *pnodeBlock;
  BlockInfoStack *pBVar2;
  ParseNodeVar *pPVar3;
  PidRefStack *pPVar4;
  ParseNodePtr this_00;
  ParseNodePtr *local_38;
  ParseNodePtr *ppnodeScopeSave;
  ParseNodePtr *ppnodeExprScopeSave;
  
  local_38 = (ParseNodePtr *)0x0;
  ppnodeScopeSave = (ParseNodePtr *)0x0;
  pnodeBlock = CreateBlockNode(this,Regular);
  pnodeBlock->scope = (Scope *)0x0;
  pBVar2 = PushBlockInfo(this,pnodeBlock);
  (pnodeBlock->super_ParseNodeStmt).grfnop = 0;
  *(ParseNodeBlock **)&(pBVar2->pstmt).field_0.field_1 = pnodeBlock;
  (pBVar2->pstmt).pLabelId = pLabelId;
  (pBVar2->pstmt).pstmtOuter = this->m_pstmtCur;
  this->m_pstmtCur = &pBVar2->pstmt;
  pBVar2 = this->m_currentBlockInfo->pBlockInfoOuter;
  if ((((pBVar2 != (BlockInfoStack *)0x0) &&
       (pPVar1 = pBVar2->pnodeBlock, pPVar1 != (ParseNodeBlock *)0x0)) &&
      (pPVar1->scope != (Scope *)0x0)) && (pPVar1->scope->scopeType == ScopeType_CatchParamPattern))
  {
    this_00 = pPVar1->pnodeLexVars;
    while (this_00 != (ParseNode *)0x0) {
      pPVar3 = ParseNode::AsParseNodeVar(this_00);
      pPVar4 = PushPidRef(this,pPVar3->sym->pid);
      pPVar3 = ParseNode::AsParseNodeVar(this_00);
      pPVar4->sym = pPVar3->sym;
      pPVar3 = ParseNode::AsParseNodeVar(this_00);
      this_00 = pPVar3->pnodeNext;
    }
  }
  ChkCurTok(this,0x52,-0x7ff5fc10);
  PushFuncBlockScope(this,pnodeBlock,&local_38,&ppnodeScopeSave);
  ParseStmtList<true>(this,&pnodeBlock->pnodeStmt,(ParseNodePtr **)0x0,SM_NotUsed,false,(bool *)0x0)
  ;
  PopFuncBlockScope(this,local_38,ppnodeScopeSave);
  FinishParseBlock(this,pnodeBlock,true);
  ChkCurTok(this,0x53,-0x7ff5fc0f);
  return pnodeBlock;
}

Assistant:

ParseNodeBlock * Parser::ParseBlock(LabelId* pLabelId)
{
    ParseNodeBlock * pnodeBlock = nullptr;
    ParseNodePtr *ppnodeScopeSave = nullptr;
    ParseNodePtr *ppnodeExprScopeSave = nullptr;

    pnodeBlock = StartParseBlock<buildAST>(PnodeBlockType::Regular, ScopeType_Block, pLabelId);

    BlockInfoStack* outerBlockInfo = m_currentBlockInfo->pBlockInfoOuter;
    if (outerBlockInfo != nullptr && outerBlockInfo->pnodeBlock != nullptr
        && outerBlockInfo->pnodeBlock->scope != nullptr
        && outerBlockInfo->pnodeBlock->scope->GetScopeType() == ScopeType_CatchParamPattern)
    {
        // If we are parsing the catch block then destructured params can have let declarations. Let's add them to the new block.
        for (ParseNodePtr pnode = m_currentBlockInfo->pBlockInfoOuter->pnodeBlock->pnodeLexVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            PidRefStack* ref = PushPidRef(pnode->AsParseNodeVar()->sym->GetPid());
            ref->SetSym(pnode->AsParseNodeVar()->sym);
        }
    }

    ChkCurTok(tkLCurly, ERRnoLcurly);
    ParseNodePtr * ppnodeList = nullptr;
    if (buildAST)
    {
        PushFuncBlockScope(pnodeBlock, &ppnodeScopeSave, &ppnodeExprScopeSave);
        ppnodeList = &pnodeBlock->pnodeStmt;
    }

    ParseStmtList<buildAST>(ppnodeList);

    if (buildAST)
    {
        PopFuncBlockScope(ppnodeScopeSave, ppnodeExprScopeSave);
    }

    FinishParseBlock(pnodeBlock);

    ChkCurTok(tkRCurly, ERRnoRcurly);

    return pnodeBlock;
}